

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O2

symbol * restricted_binop_type
                   (dmr_C *C,int op,expression *left,expression *right,int lclass,int rclass,
                   symbol *ltype,symbol *rtype)

{
  unsigned_long_long uVar1;
  uint uVar2;
  symbol *psVar3;
  undefined4 in_register_00000034;
  undefined4 in_register_0000008c;
  
  if (((ulong)right & 4) == 0) {
    if (*(char *)CONCAT44(in_register_00000034,op) != '\x01') {
      return (symbol *)0x0;
    }
    uVar1 = *(unsigned_long_long *)(CONCAT44(in_register_00000034,op) + 0x20);
    psVar3 = ltype;
joined_r0x0010d86f:
    if (uVar1 != 0) {
      return (symbol *)0x0;
    }
  }
  else {
    psVar3 = (symbol *)CONCAT44(in_register_0000008c,rclass);
    if ((lclass & 4U) == 0) {
      if (*(char *)left != '\x01') {
        return (symbol *)0x0;
      }
      uVar1 = (left->field_5).field_0.value;
      goto joined_r0x0010d86f;
    }
    if (psVar3 != ltype) {
      if (((ulong)right & 0x40) == 0) {
        if ((lclass & 0x40U) == 0) {
          return (symbol *)0x0;
        }
        if ((ltype->field_14).field_2.ctype.base_type != psVar3) {
          return (symbol *)0x0;
        }
      }
      else if ((psVar3->field_14).field_2.ctype.base_type != ltype) {
        return (symbol *)0x0;
      }
      goto LAB_0010d897;
    }
  }
  if (psVar3 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
LAB_0010d897:
  uVar2 = restricted_binop((int)C);
  psVar3 = (symbol *)(*(code *)(&DAT_001318e8 + *(int *)(&DAT_001318e8 + (ulong)uVar2 * 4)))();
  return psVar3;
}

Assistant:

static struct symbol *restricted_binop_type(struct dmr_C *C, int op,
					struct expression *left,
					struct expression *right,
					int lclass, int rclass,
					struct symbol *ltype,
					struct symbol *rtype)
{
        (void) C;
	struct symbol *ctype = NULL;
	if (lclass & TYPE_RESTRICT) {
		if (rclass & TYPE_RESTRICT) {
			if (ltype == rtype) {
				ctype = ltype;
			} else if (lclass & TYPE_FOULED) {
				if (unfoul(ltype) == rtype)
					ctype = ltype;
			} else if (rclass & TYPE_FOULED) {
				if (unfoul(rtype) == ltype)
					ctype = rtype;
			}
		} else {
			if (!restricted_value(right, ltype))
				ctype = ltype;
		}
	} else if (!restricted_value(left, rtype))
		ctype = rtype;

	if (ctype) {
		switch (restricted_binop(op)) {
		case 1:
			if ((lclass ^ rclass) & TYPE_FOULED)
				ctype = unfoul(ctype);
			break;
		case 3:
			if (!(lclass & rclass & TYPE_FOULED))
				break;
		case 0:
			ctype = NULL;
		default:
			break;
		}
	}

	return ctype;
}